

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O3

int AF_A_Burnination(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  double dVar2;
  VM_UBYTE VVar3;
  undefined8 *puVar4;
  sector_t *psVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  PClass *pPVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  undefined4 extraout_var;
  PClass *pPVar14;
  subsector_t *psVar15;
  AActor *pAVar16;
  AActor *ent;
  VMValue *pVVar17;
  char *__assertion;
  bool bVar18;
  bool bVar19;
  FSoundID local_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  DVector3 local_48;
  
  pPVar9 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005fa8d5;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ent = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (ent == (AActor *)0x0) {
LAB_005fa5a4:
        ent = (AActor *)0x0;
        pVVar17 = param;
        uVar11 = numparam;
      }
      else {
        pPVar14 = (ent->super_DThinker).super_DObject.Class;
        if (pPVar14 == (PClass *)0x0) {
          iVar10 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
          pPVar14 = (PClass *)CONCAT44(extraout_var,iVar10);
          (ent->super_DThinker).super_DObject.Class = pPVar14;
        }
        bVar18 = pPVar14 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar18;
        bVar19 = pPVar14 == pPVar9;
        if (!bVar19 && !bVar18) {
          do {
            pPVar14 = pPVar14->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar14 != (PClass *)0x0);
            if (pPVar14 == pPVar9) break;
          } while (pPVar14 != (PClass *)0x0);
        }
        pVVar17 = (VMValue *)(ulong)(bVar19 || bVar18);
        uVar11 = (uint)bVar18;
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005fa8d5;
        }
      }
      pPVar9 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005fa664;
      VVar3 = param[1].field_0.field_3.Type;
      if (VVar3 != 0xff) {
        if (VVar3 != '\x03') goto LAB_005fa8c5;
        puVar4 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar4 != (undefined8 *)0x0) {
            pPVar14 = (PClass *)puVar4[1];
            if (pPVar14 == (PClass *)0x0) {
              pPVar14 = (PClass *)(**(code **)*puVar4)(puVar4,pVVar17,uVar11,ret);
              puVar4[1] = pPVar14;
            }
            bVar18 = pPVar14 != (PClass *)0x0;
            if (pPVar14 != pPVar9 && bVar18) {
              do {
                pPVar14 = pPVar14->ParentClass;
                bVar18 = pPVar14 != (PClass *)0x0;
                if (pPVar14 == pPVar9) break;
              } while (pPVar14 != (PClass *)0x0);
            }
            if (!bVar18) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005fa8d5;
            }
          }
        }
        else if (puVar4 != (undefined8 *)0x0) goto LAB_005fa8c5;
      }
      if (((numparam < 3) || (VVar3 = param[2].field_0.field_3.Type, VVar3 == 0xff)) ||
         ((VVar3 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005fa664:
        (ent->Vel).Z = (ent->Vel).Z + -8.0;
        uVar11 = FRandom::GenRand32(&pr_phburn);
        uVar12 = FRandom::GenRand32(&pr_phburn);
        (ent->Vel).X = (double)(int)((uVar11 & 3) - (uVar12 & 3)) + (ent->Vel).X;
        uVar11 = FRandom::GenRand32(&pr_phburn);
        uVar12 = FRandom::GenRand32(&pr_phburn);
        (ent->Vel).Y = (double)(int)((uVar11 & 3) - (uVar12 & 3)) + (ent->Vel).Y;
        local_5c.ID = S_FindSound("world/largefire");
        S_Sound(ent,2,&local_5c,1.0,1.0);
        if (((ent->flags).Value & 0x20000) == 0) {
          uVar12 = FRandom::GenRand32(&pr_phburn);
          uVar13 = FRandom::GenRand32(&pr_phburn);
          uVar11 = -(uVar12 & 0x1f);
          if (-1 < (char)uVar12) {
            uVar11 = uVar12 & 0x1f;
          }
          uVar12 = -(uVar13 & 0x1f);
          if (-1 < (char)uVar13) {
            uVar12 = uVar13 & 0x1f;
          }
          P_GetOffsetPosition((ent->__Pos).X,(ent->__Pos).Y,(double)(int)uVar11,(double)(int)uVar12)
          ;
          psVar15 = P_PointInSubsector((double)CONCAT44(uStack_54,local_58),
                                       (double)CONCAT44(uStack_4c,uStack_50));
          psVar5 = psVar15->sector;
          auVar8._8_4_ = uStack_50;
          auVar8._0_8_ = CONCAT44(uStack_54,local_58);
          auVar8._12_4_ = uStack_4c;
          local_48.Z = (ent->__Pos).Z;
          if (ent->MaxStepHeight + local_48.Z <
              ((psVar5->floorplane).normal.Y * auVar8._8_8_ +
              (psVar5->floorplane).D +
              (psVar5->floorplane).normal.X * (double)CONCAT44(uStack_54,local_58)) *
              (psVar5->floorplane).negiC) {
            local_58 = *(undefined4 *)&(ent->__Pos).X;
            uStack_54 = *(undefined4 *)((long)&(ent->__Pos).X + 4);
            uStack_50 = *(undefined4 *)&(ent->__Pos).Y;
            uStack_4c = *(undefined4 *)((long)&(ent->__Pos).Y + 4);
          }
          local_48.Z = local_48.Z + 4.0;
          local_48.X._0_4_ = local_58;
          local_48.X._4_4_ = uStack_54;
          local_48.Y._0_4_ = uStack_50;
          local_48.Y._4_4_ = uStack_4c;
          pAVar16 = AActor::StaticSpawn((PClassActor *)APhosphorousFire::RegistrationInfo.MyClass,
                                        &local_48,ALLOW_REPLACE,false);
          if (pAVar16 != (AActor *)0x0) {
            dVar2 = (ent->Vel).X;
            uVar11 = FRandom::GenRand32(&pr_phburn);
            uVar12 = FRandom::GenRand32(&pr_phburn);
            (pAVar16->Vel).X = (double)(int)((uVar11 & 7) - (uVar12 & 7)) + dVar2;
            dVar2 = (ent->Vel).Y;
            uVar11 = FRandom::GenRand32(&pr_phburn);
            uVar12 = FRandom::GenRand32(&pr_phburn);
            dVar2 = (double)(int)((uVar11 & 7) - (uVar12 & 7)) + dVar2;
            dVar7 = (ent->Vel).Z + -1.0;
            auVar6._8_4_ = SUB84(dVar7,0);
            auVar6._0_8_ = dVar2;
            auVar6._12_4_ = (int)((ulong)dVar7 >> 0x20);
            (pAVar16->Vel).Y = dVar2;
            (pAVar16->Vel).Z = (double)auVar6._8_8_;
            uVar11 = FRandom::GenRand32(&pr_phburn);
            pAVar16->reactiontime = (uVar11 & 3) + 2;
            pbVar1 = (byte *)((long)&(pAVar16->flags).Value + 2);
            *pbVar1 = *pbVar1 | 2;
          }
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005fa8d5;
    }
    if (ent == (AActor *)0x0) goto LAB_005fa5a4;
  }
LAB_005fa8c5:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005fa8d5:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                ,0x277,"int AF_A_Burnination(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Burnination)
{
	PARAM_ACTION_PROLOGUE;

	self->Vel.Z -= 8;
	self->Vel.X += (pr_phburn.Random2 (3));
	self->Vel.Y += (pr_phburn.Random2 (3));
	S_Sound (self, CHAN_VOICE, "world/largefire", 1, ATTN_NORM);

	// Only the main fire spawns more.
	if (!(self->flags & MF_DROPPED))
	{
		// Original x and y offsets seemed to be like this:
		//		x + (((pr_phburn() + 12) & 31) << F.RACBITS);
		//
		// But that creates a lop-sided burn because it won't use negative offsets.
		int xofs, xrand = pr_phburn();
		int yofs, yrand = pr_phburn();

		// Adding 12 is pointless if you're going to mask it afterward.
		xofs = xrand & 31;
		if (xrand & 128)
		{
			xofs = -xofs;
		}

		yofs = yrand & 31;
		if (yrand & 128)
		{
			yofs = -yofs;
		}

		DVector2 pos = self->Vec2Offset((double)xofs, (double)yofs);
		sector_t * sector = P_PointInSector(pos);

		// The sector's floor is too high so spawn the flame elsewhere.
		if (sector->floorplane.ZatPoint(pos) > self->Z() + self->MaxStepHeight)
		{
			pos = self->Pos();
		}

		AActor *drop = Spawn<APhosphorousFire> (DVector3(pos, self->Z() + 4.), ALLOW_REPLACE);
		if (drop != NULL)
		{
			drop->Vel.X = self->Vel.X + pr_phburn.Random2 (7);
			drop->Vel.Y = self->Vel.Y + pr_phburn.Random2 (7);
			drop->Vel.Z = self->Vel.Z - 1;
			drop->reactiontime = (pr_phburn() & 3) + 2;
			drop->flags |= MF_DROPPED;
		}
	}
	return 0;
}